

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O1

void search_wiener(RestorationTileLimits *limits,int rest_unit_idx,void *priv,int32_t *tmpbuf,
                  RestorationLineBuffers *rlbs,aom_internal_error_info *error_info)

{
  short *psVar1;
  int iVar2;
  aom_bit_depth_t aVar3;
  long lVar4;
  double dVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  int16_t iVar11;
  int i;
  uint wiener_win;
  uint stride;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint64_t uVar19;
  _func_void_int_uint8_t_ptr_uint8_t_ptr_int16_t_ptr_int16_t_ptr_int_int_int_int_int_int_int64_t_ptr_int64_t_ptr_aom_bit_depth_t
  **pp_Var20;
  ulong uVar21;
  long lVar22;
  int64_t iVar23;
  byte bVar24;
  undefined2 uVar25;
  short sVar26;
  short sVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  long *plVar33;
  long lVar34;
  int64_t **ppiVar35;
  ulong uVar36;
  long lVar37;
  uint uVar38;
  int iVar39;
  int iVar40;
  int64_t *piVar41;
  int64_t iVar42;
  ulong uVar43;
  int iVar44;
  int64_t *piVar45;
  ulong uVar46;
  long lVar47;
  ulong uVar48;
  uint uVar49;
  long lVar50;
  WienerInfo *wiener_info;
  ulong uVar51;
  long lVar52;
  bool bVar53;
  ushort uVar54;
  ushort uVar56;
  double dVar55;
  int64_t B [16];
  int64_t A [4];
  int64_t S [7];
  int32_t hfilter [7];
  int32_t vfilter [7];
  int64_t *Mc [7];
  int32_t b2 [7];
  int32_t b1 [7];
  int64_t *Hc [49];
  int64_t M [49];
  int64_t H [2401];
  
  lVar4 = *(long *)((long)priv + 0x18);
  uVar30 = (ulong)*(int *)(lVar4 + 0xb93c);
  wiener_info = (WienerInfo *)((long)rest_unit_idx * 0x40 + *(long *)((long)priv + 0x30));
  if (*(int *)(*(long *)((long)priv + 0x38) + 0x2c) != 0) {
    iVar11 = av1_dc_quant_QTX(*(int *)(*(long *)((long)priv + 0x10) + 0x268),0,
                              *(aom_bit_depth_t *)
                               (*(long *)(*(long *)((long)priv + 0x10) + 0x6088) + 0x48));
    iVar2 = *(int *)(&DAT_00505128 + (long)*(int *)(*(long *)((long)priv + 0x38) + 0x2c) * 4);
    uVar19 = (*var_part_extractors
               [(ulong)*(byte *)(*(long *)(*(long *)((long)priv + 0x10) + 0x6088) + 0x4c) * 3 +
                (long)*(int *)((long)priv + 0x20)])
                       (*priv,limits->h_start,limits->h_end - limits->h_start,limits->v_start,
                        limits->v_end - limits->v_start);
    bVar53 = true;
    if ((ulong)(long)(((int)iVar11 >> 3) * ((int)iVar11 >> 3) * iVar2 >> 4) <= uVar19) {
      bVar53 = *(long *)((long)priv + 0x60) == 0;
    }
    if (bVar53) {
      *(long *)((long)priv + 0xa8) = *(long *)((long)priv + 0xa8) + uVar30;
      *(long *)((long)priv + 0x88) = *(long *)((long)priv + 0x88) + *(long *)((long)priv + 0x60);
      wiener_info[1].vfilter[6] = 0;
      wiener_info[1].vfilter[7] = 0;
      *(undefined8 *)((long)priv + 0x68) = 0x7fffffffffffffff;
      if (*(int *)(*(long *)((long)priv + 0x38) + 0x30) == 2) {
        *(undefined1 *)((long)priv + 0x78) = 1;
      }
      if (bVar53) {
        return;
      }
    }
  }
  iVar2 = *(int *)((long)priv + 0x20);
  wiener_win = (iVar2 == 0) + 5 + (uint)(iVar2 == 0);
  iVar18 = *(int *)(*(long *)((long)priv + 0x38) + 0x34);
  uVar51 = 5;
  if (iVar18 == 0) {
    uVar51 = (ulong)wiener_win;
  }
  lVar34 = *(long *)(*(long *)((long)priv + 0x10) + 0x6088);
  if (*(char *)(lVar34 + 0x4c) == '\0') {
    aVar3 = *(aom_bit_depth_t *)(*(long *)((long)priv + 0x38) + 0x3c);
    pp_Var20 = (_func_void_int_uint8_t_ptr_uint8_t_ptr_int16_t_ptr_int16_t_ptr_int_int_int_int_int_int_int64_t_ptr_int64_t_ptr_aom_bit_depth_t
                **)&av1_compute_stats;
  }
  else {
    aVar3 = *(aom_bit_depth_t *)(lVar34 + 0x48);
    pp_Var20 = &av1_compute_stats_highbd;
  }
  iVar10 = (int)uVar51;
  (**pp_Var20)(iVar10,*(uint8_t **)((long)priv + 0x40),*(uint8_t **)((long)priv + 0x50),
               *(int16_t **)((long)priv + 0x120),*(int16_t **)((long)priv + 0x128),limits->h_start,
               limits->h_end,limits->v_start,limits->v_end,*(int *)((long)priv + 0x48),
               *(int *)((long)priv + 0x58),M,H,aVar3);
  uVar36 = uVar51 >> 1;
  uVar38 = (uint)uVar36;
  uVar48 = (ulong)(uVar38 ^ 3);
  uVar31 = 0;
  do {
    iVar12 = *(int *)(wiener_decompose_sep_sym_init_filt + (ulong)((uVar38 ^ 3) << 2) + uVar31 * 4);
    hfilter[uVar31] = iVar12 << 9;
    vfilter[uVar31] = iVar12 << 9;
    uVar31 = uVar31 + 1;
  } while (uVar51 != uVar31);
  uVar28 = iVar10 * iVar10;
  uVar31 = (ulong)(uint)(iVar10 * 8);
  ppiVar35 = Hc;
  piVar41 = H;
  uVar43 = 0;
  do {
    Mc[uVar43] = M + uVar43 * uVar51;
    uVar46 = 0;
    piVar45 = piVar41;
    do {
      *(int64_t **)((long)ppiVar35 + uVar46) = piVar45;
      uVar46 = uVar46 + 8;
      piVar45 = (int64_t *)((long)piVar45 + uVar31);
    } while (uVar31 != uVar46);
    uVar43 = uVar43 + 1;
    ppiVar35 = (int64_t **)((long)ppiVar35 + uVar31);
    piVar41 = (int64_t *)((long)piVar41 + (ulong)(uVar28 * iVar10 * 8));
  } while (uVar43 != uVar51);
  stride = uVar38 + 1;
  uVar29 = (uVar38 + 2) * uVar38;
  iVar12 = stride * uVar38;
  uVar31 = (ulong)(uVar38 * 8);
  lVar34 = uVar31 + 8;
  uVar13 = (iVar10 - uVar38) - 2;
  iVar17 = 1;
  do {
    A[0] = 0;
    A[1] = 0;
    A[2] = 0;
    A[3] = 0;
    B[0] = 0;
    B[1] = 0;
    B[2] = 0;
    B[3] = 0;
    B[4] = 0;
    B[5] = 0;
    B[6] = 0;
    B[7] = 0;
    B[8] = 0;
    B[9] = 0;
    B[10] = 0;
    B[0xb] = 0;
    B[0xc] = 0;
    B[0xd] = 0;
    B[0xe] = 0;
    B[0xf] = 0;
    uVar43 = 0;
    do {
      piVar41 = Mc[uVar43];
      iVar15 = hfilter[uVar43];
      uVar46 = 0;
      iVar39 = iVar10 + -1;
      do {
        iVar44 = (int)uVar46;
        if (uVar36 < uVar46) {
          iVar44 = iVar39;
        }
        lVar47 = piVar41[uVar46] * (long)iVar15;
        lVar22 = lVar47 + 0xffff;
        if (-1 < lVar47) {
          lVar22 = lVar47;
        }
        A[iVar44] = A[iVar44] + (lVar22 >> 0x10);
        uVar46 = uVar46 + 1;
        iVar39 = iVar39 + -1;
      } while (uVar46 != uVar51);
      uVar43 = uVar43 + 1;
    } while (uVar43 != uVar51);
    uVar43 = 0;
    do {
      iVar15 = hfilter[uVar43];
      iVar39 = iVar15 + 0xffff;
      if (-1 < iVar15) {
        iVar39 = iVar15;
      }
      b1[uVar43] = iVar39 >> 0x10;
      b2[uVar43] = iVar15 % 0x10000;
      uVar43 = uVar43 + 1;
    } while (uVar51 != uVar43);
    uVar43 = 0;
    do {
      iVar15 = hfilter[uVar43];
      uVar46 = 0;
      do {
        piVar41 = Hc[uVar43 + uVar46 * uVar51];
        iVar39 = b1[uVar46];
        iVar44 = b2[uVar46];
        uVar21 = 0;
        do {
          uVar49 = ~(uint)uVar21 + iVar10;
          if (uVar21 <= uVar36) {
            uVar49 = (uint)uVar21;
          }
          uVar32 = 0;
          iVar14 = iVar10 + -1;
          do {
            iVar40 = (int)uVar32;
            if (uVar36 < uVar32) {
              iVar40 = iVar14;
            }
            lVar47 = piVar41[uVar32] * (long)iVar15;
            lVar22 = lVar47 + 0xffff;
            if (-1 < lVar47) {
              lVar22 = lVar47;
            }
            lVar52 = (lVar22 >> 0x10) * (long)iVar44;
            lVar47 = lVar52 + 0xffff;
            if (-1 < lVar52) {
              lVar47 = lVar52;
            }
            iVar40 = iVar40 * stride + uVar49;
            B[iVar40] = (lVar22 >> 0x10) * (long)iVar39 + B[iVar40] + (lVar47 >> 0x10);
            uVar32 = uVar32 + 1;
            iVar14 = iVar14 + -1;
          } while (uVar32 != uVar51);
          uVar21 = uVar21 + 1;
          piVar41 = (int64_t *)((long)piVar41 + (ulong)(uVar28 * 8));
        } while (uVar21 != uVar51);
        uVar46 = uVar46 + 1;
      } while (uVar46 != uVar51);
      uVar43 = uVar43 + 1;
    } while (uVar43 != uVar51);
    lVar22 = B[uVar29];
    uVar43 = 0;
    plVar33 = (long *)((long)B + uVar31);
    do {
      A[uVar43] = (A[uVar43] - *plVar33) + (lVar22 - A[uVar36]) * 2;
      uVar43 = uVar43 + 1;
      plVar33 = (long *)((long)plVar33 + lVar34);
    } while (uVar36 != uVar43);
    piVar41 = B;
    uVar43 = 0;
    do {
      uVar46 = 0;
      do {
        piVar41[uVar46] =
             piVar41[uVar46] +
             B[iVar12 + uVar38] * 4 +
             (*(long *)((long)B + uVar46 * 8 + (ulong)(uint)(iVar12 * 8)) +
             B[uVar43 * stride + uVar36]) * -2;
        uVar46 = uVar46 + 1;
      } while (uVar36 != uVar46);
      uVar43 = uVar43 + 1;
      piVar41 = (int64_t *)((long)piVar41 + lVar34);
    } while (uVar43 != uVar36);
    iVar15 = linsolve_wiener(uVar38,B,stride,A,S);
    if (iVar15 != 0) {
      S[uVar36] = 0x10000;
      lVar22 = 1;
      plVar33 = S + uVar13;
      do {
        lVar47 = *plVar33;
        *(long *)((long)S + lVar22 * 8 + uVar31) = lVar47;
        S[uVar36] = S[uVar36] + lVar47 * -2;
        lVar22 = lVar22 + 1;
        plVar33 = plVar33 + -1;
      } while (uVar51 - uVar36 != lVar22);
      uVar43 = 0;
      do {
        lVar22 = S[uVar43];
        if (0x1ffffffe < lVar22) {
          lVar22 = 0x1fffffff;
        }
        if (lVar22 < -0x1fffffff) {
          lVar22 = -0x20000000;
        }
        vfilter[uVar43] = (int32_t)lVar22;
        uVar43 = uVar43 + 1;
      } while (uVar51 != uVar43);
    }
    A[0] = 0;
    A[1] = 0;
    A[2] = 0;
    A[3] = 0;
    B[0] = 0;
    B[1] = 0;
    B[2] = 0;
    B[3] = 0;
    B[4] = 0;
    B[5] = 0;
    B[6] = 0;
    B[7] = 0;
    B[8] = 0;
    B[9] = 0;
    B[10] = 0;
    B[0xb] = 0;
    B[0xc] = 0;
    B[0xd] = 0;
    B[0xe] = 0;
    B[0xf] = 0;
    uVar43 = 0;
    do {
      uVar49 = ~(uint)uVar43 + iVar10;
      if (uVar43 <= uVar36) {
        uVar49 = (uint)uVar43;
      }
      iVar42 = A[(int)uVar49];
      uVar46 = 0;
      do {
        lVar47 = (long)vfilter[uVar46] * Mc[uVar43][uVar46];
        lVar22 = lVar47 + 0xffff;
        if (-1 < lVar47) {
          lVar22 = lVar47;
        }
        iVar42 = iVar42 + (lVar22 >> 0x10);
        uVar46 = uVar46 + 1;
      } while (uVar51 != uVar46);
      A[(int)uVar49] = iVar42;
      uVar43 = uVar43 + 1;
    } while (uVar43 != uVar51);
    uVar43 = 0;
    do {
      iVar15 = vfilter[uVar43];
      iVar39 = iVar15 + 0xffff;
      if (-1 < iVar15) {
        iVar39 = iVar15;
      }
      b1[uVar43] = iVar39 >> 0x10;
      b2[uVar43] = iVar15 % 0x10000;
      uVar43 = uVar43 + 1;
    } while (uVar51 != uVar43);
    uVar43 = 0;
    do {
      uVar49 = ~(uint)uVar43 + iVar10;
      if (uVar43 <= uVar36) {
        uVar49 = (uint)uVar43;
      }
      uVar46 = 0;
      do {
        uVar16 = ~(uint)uVar46 + iVar10;
        if (uVar46 <= uVar36) {
          uVar16 = (uint)uVar46;
        }
        iVar15 = uVar16 * stride + uVar49;
        piVar41 = Hc[uVar43 * uVar51 + uVar46];
        iVar42 = B[iVar15];
        uVar21 = 0;
        do {
          uVar32 = 0;
          do {
            lVar47 = piVar41[uVar32] * (long)vfilter[uVar21];
            lVar22 = lVar47 + 0xffff;
            if (-1 < lVar47) {
              lVar22 = lVar47;
            }
            lVar52 = (long)b2[uVar32] * (lVar22 >> 0x10);
            lVar47 = lVar52 + 0xffff;
            if (-1 < lVar52) {
              lVar47 = lVar52;
            }
            iVar42 = iVar42 + (long)b1[uVar32] * (lVar22 >> 0x10) + (lVar47 >> 0x10);
            uVar32 = uVar32 + 1;
          } while (uVar51 != uVar32);
          uVar21 = uVar21 + 1;
          piVar41 = (int64_t *)((long)piVar41 + (ulong)(uVar28 * 8));
        } while (uVar21 != uVar51);
        B[iVar15] = iVar42;
        uVar46 = uVar46 + 1;
      } while (uVar46 != uVar51);
      uVar43 = uVar43 + 1;
    } while (uVar43 != uVar51);
    lVar22 = B[uVar29];
    uVar43 = 0;
    plVar33 = (long *)((long)B + uVar31);
    do {
      A[uVar43] = (A[uVar43] - *plVar33) + (lVar22 - A[uVar36]) * 2;
      uVar43 = uVar43 + 1;
      plVar33 = (long *)((long)plVar33 + lVar34);
    } while (uVar36 != uVar43);
    piVar41 = B;
    uVar43 = 0;
    do {
      uVar46 = 0;
      do {
        piVar41[uVar46] =
             piVar41[uVar46] +
             B[iVar12 + uVar38] * 4 +
             (*(long *)((long)B + uVar46 * 8 + (ulong)(uint)(iVar12 * 8)) +
             B[uVar43 * stride + uVar36]) * -2;
        uVar46 = uVar46 + 1;
      } while (uVar36 != uVar46);
      uVar43 = uVar43 + 1;
      piVar41 = (int64_t *)((long)piVar41 + lVar34);
    } while (uVar43 != uVar36);
    iVar15 = linsolve_wiener(uVar38,B,stride,A,S);
    if (iVar15 != 0) {
      S[uVar36] = 0x10000;
      lVar22 = 1;
      plVar33 = S + uVar13;
      do {
        lVar47 = *plVar33;
        *(long *)((long)S + lVar22 * 8 + uVar31) = lVar47;
        S[uVar36] = S[uVar36] + lVar47 * -2;
        lVar22 = lVar22 + 1;
        plVar33 = plVar33 + -1;
      } while (uVar51 - uVar36 != lVar22);
      uVar43 = 0;
      do {
        lVar22 = S[uVar43];
        if (0x1ffffffe < lVar22) {
          lVar22 = 0x1fffffff;
        }
        if (lVar22 < -0x1fffffff) {
          lVar22 = -0x20000000;
        }
        hfilter[uVar43] = (int32_t)lVar22;
        uVar43 = uVar43 + 1;
      } while (uVar51 != uVar43);
    }
    iVar17 = iVar17 + 1;
  } while (iVar17 != 5);
  B[1] = 0;
  B[6] = 0;
  B[7] = 0;
  B[4] = 0;
  B[5] = 0;
  B[2] = 0;
  B[3] = 0;
  B[0] = 1;
  uVar31 = 0;
  do {
    lVar34 = (long)vfilter[uVar31] * 0x80;
    if ((long)vfilter[uVar31] < 0) {
      lVar22 = lVar34 + 0x7fff;
      if (-1 < lVar34 + -0x8000) {
        lVar22 = lVar34 + -0x8000;
      }
      uVar25 = (undefined2)((ulong)lVar22 >> 0x10);
    }
    else {
      uVar25 = (undefined2)((ulong)(lVar34 + 0x8000) >> 0x10);
    }
    *(undefined2 *)((long)B + uVar31 * 2 + 0x10) = uVar25;
    uVar31 = uVar31 + 1;
  } while (uVar36 != uVar31);
  if (iVar18 != 0 || iVar2 != 0) {
    uVar54 = (ushort)(8 < (short)B[2]) * 8 | (ushort)(8 >= (short)B[2]) * (short)B[2];
    uVar56 = (ushort)(0x2e < B[2]._2_2_) * 0x2e | (ushort)(0x2e >= B[2]._2_2_) * B[2]._2_2_;
    B[2] = (ulong)CONCAT22((ushort)((short)uVar56 < -0x11) * -0x11 |
                           ((short)uVar56 >= -0x11) * uVar56,
                           (ushort)((short)uVar54 < -0x17) * -0x17 |
                           ((short)uVar54 >= -0x17) * uVar54) << 0x10;
  }
  else {
    uVar54 = (ushort)(10 < (short)B[2]) * 10 | (ushort)(10 >= (short)B[2]) * (short)B[2];
    uVar56 = (ushort)(8 < B[2]._2_2_) * 8 | (ushort)(8 >= B[2]._2_2_) * B[2]._2_2_;
    sVar26 = (short)((ulong)B[2] >> 0x20);
    sVar27 = 0x2e;
    if (sVar26 < 0x2e) {
      sVar27 = sVar26;
    }
    sVar26 = -0x11;
    if (-0x11 < sVar27) {
      sVar26 = sVar27;
    }
    B[2]._0_6_ = CONCAT24(sVar26,CONCAT22((ushort)((short)uVar56 < -0x17) * -0x17 |
                                          ((short)uVar56 >= -0x17) * uVar56,
                                          (ushort)((short)uVar54 < -5) * -5 |
                                          ((short)uVar54 >= -5) * uVar54));
    B[2] = CONCAT26(0,(uint6)B[2]);
  }
  sVar27 = (short)((ulong)B[2] >> 0x20);
  B[3] = CONCAT62(CONCAT42(CONCAT22(B[3]._6_2_,(short)B[2]),B[2]._2_2_),sVar27);
  sVar26 = B[2]._2_2_ + (short)B[2];
  B[2] = CONCAT26((sVar26 + sVar27) * -2,(uint6)B[2]);
  uVar31 = 0;
  do {
    lVar34 = (long)hfilter[uVar31] * 0x80;
    if ((long)hfilter[uVar31] < 0) {
      lVar22 = lVar34 + 0x7fff;
      if (-1 < lVar34 + -0x8000) {
        lVar22 = lVar34 + -0x8000;
      }
      uVar25 = (undefined2)((ulong)lVar22 >> 0x10);
    }
    else {
      uVar25 = (undefined2)((ulong)(lVar34 + 0x8000) >> 0x10);
    }
    *(undefined2 *)((long)B + uVar31 * 2 + 0x20) = uVar25;
    uVar31 = uVar31 + 1;
  } while (uVar36 != uVar31);
  if (iVar18 != 0 || iVar2 != 0) {
    uVar54 = (ushort)(8 < (short)B[4]) * 8 | (ushort)(8 >= (short)B[4]) * (short)B[4];
    uVar56 = (ushort)(0x2e < B[4]._2_2_) * 0x2e | (ushort)(0x2e >= B[4]._2_2_) * B[4]._2_2_;
    B[4] = (ulong)CONCAT22((ushort)((short)uVar56 < -0x11) * -0x11 |
                           ((short)uVar56 >= -0x11) * uVar56,
                           (ushort)((short)uVar54 < -0x17) * -0x17 |
                           ((short)uVar54 >= -0x17) * uVar54) << 0x10;
  }
  else {
    uVar54 = (ushort)(10 < (short)B[4]) * 10 | (ushort)(10 >= (short)B[4]) * (short)B[4];
    uVar56 = (ushort)(8 < B[4]._2_2_) * 8 | (ushort)(8 >= B[4]._2_2_) * B[4]._2_2_;
    sVar26 = (short)((ulong)B[4] >> 0x20);
    sVar27 = 0x2e;
    if (sVar26 < 0x2e) {
      sVar27 = sVar26;
    }
    sVar26 = -0x11;
    if (-0x11 < sVar27) {
      sVar26 = sVar27;
    }
    B[4]._0_6_ = CONCAT24(sVar26,CONCAT22((ushort)((short)uVar56 < -0x17) * -0x17 |
                                          ((short)uVar56 >= -0x17) * uVar56,
                                          (ushort)((short)uVar54 < -5) * -5 |
                                          ((short)uVar54 >= -5) * uVar54));
    B[4] = CONCAT26(0,(uint6)B[4]);
  }
  sVar27 = (short)((ulong)B[4] >> 0x20);
  B[5] = CONCAT62(CONCAT42(CONCAT22(B[5]._6_2_,(short)B[4]),B[4]._2_2_),sVar27);
  sVar26 = B[4]._2_2_ + (short)B[4];
  B[4] = CONCAT26((sVar26 + sVar27) * -2,(uint6)B[4]);
  Mc[0]._6_2_ = 0x80;
  S[0]._6_2_ = 0x80;
  lVar34 = 0xc;
  lVar22 = 0;
  do {
    sVar26 = *(short *)((long)B + lVar22 + 0x10);
    *(short *)((long)S + lVar34) = sVar26;
    *(short *)((long)S + lVar22) = sVar26;
    sVar27 = *(short *)((long)B + lVar22 + 0x20);
    *(short *)((long)Mc + lVar34) = sVar27;
    *(short *)((long)Mc + lVar22) = sVar27;
    S[0]._6_2_ = S[0]._6_2_ + sVar26 * -2;
    Mc[0]._6_2_ = Mc[0]._6_2_ + sVar27 * -2;
    lVar22 = lVar22 + 2;
    lVar34 = lVar34 + -2;
  } while (lVar22 != 6);
  ppiVar35 = Hc;
  uVar36 = 0;
  memset(ppiVar35,0,0xc4);
  do {
    sVar26 = *(short *)((long)Mc + (uVar36 + uVar48) * 2);
    uVar31 = 0;
    do {
      *(int *)((long)ppiVar35 + uVar31 * 4) =
           (int)*(short *)((long)S + uVar31 * 2 + uVar48 * 2) * (int)sVar26;
      uVar31 = uVar31 + 1;
    } while (uVar51 != uVar31);
    uVar36 = uVar36 + 1;
    ppiVar35 = (int64_t **)((long)ppiVar35 + (ulong)(uint)(iVar10 * 4));
  } while (uVar36 != uVar51);
  piVar41 = H;
  uVar51 = 0;
  lVar22 = 0;
  lVar34 = 0;
  do {
    lVar52 = (long)*(int *)((long)Hc + uVar51 * 4);
    lVar47 = M[uVar51] * lVar52;
    uVar36 = 0;
    do {
      lVar37 = (long)*(int *)((long)Hc + uVar36 * 4) * piVar41[uVar36] * lVar52;
      lVar50 = lVar37 + 0xfffffff;
      if (-1 < lVar37) {
        lVar50 = lVar37;
      }
      lVar34 = lVar34 + (lVar50 >> 0x1c);
      uVar36 = uVar36 + 1;
    } while (uVar28 != uVar36);
    lVar52 = lVar47 + 0x3fff;
    if (-1 < lVar47) {
      lVar52 = lVar47;
    }
    lVar22 = lVar22 + (lVar52 >> 0xe);
    uVar51 = uVar51 + 1;
    piVar41 = (int64_t *)((long)piVar41 + (ulong)(uVar28 * 8));
  } while (uVar51 != uVar28);
  if (0 < (lVar34 - H[(uVar28 + 1) * (uVar28 >> 1)]) + (M[uVar28 >> 1] - lVar22) * 2) {
    *(long *)((long)priv + 0xa8) = *(long *)((long)priv + 0xa8) + uVar30;
    *(long *)((long)priv + 0x88) = *(long *)((long)priv + 0x88) + *(long *)((long)priv + 0x60);
    wiener_info[1].vfilter[6] = 0;
    wiener_info[1].vfilter[7] = 0;
    *(undefined8 *)((long)priv + 0x68) = 0x7fffffffffffffff;
    if (*(int *)(*(long *)((long)priv + 0x38) + 0x30) != 2) {
      return;
    }
    *(undefined1 *)((long)priv + 0x78) = 1;
    return;
  }
  iVar42 = try_restoration_unit((RestSearchCtxt *)priv,limits,(RestorationUnitInfo *)B);
  if (*(char *)(*(long *)((long)priv + 0x38) + 0x3a) == '\0') {
    uVar38 = 4;
    do {
      sVar26 = (short)uVar38;
      sVar27 = sVar26 * 2;
      uVar51 = uVar48;
      do {
        iVar2 = *(int *)(&DAT_0050515c + uVar51 * 4);
        lVar34 = 6 - uVar51;
        iVar23 = iVar42;
        bVar53 = false;
        do {
          bVar9 = bVar53;
          iVar18 = (int)*(short *)((long)B + uVar51 * 2 + 0x20) - uVar38;
          iVar42 = iVar23;
          if (iVar18 < iVar2) break;
          *(short *)((long)B + uVar51 * 2 + 0x20) = (short)iVar18;
          psVar1 = (short *)((long)B + lVar34 * 2 + 0x20);
          *psVar1 = *psVar1 - sVar26;
          B[4] = CONCAT26(B[4]._6_2_ + sVar27,(uint6)B[4]);
          iVar42 = try_restoration_unit((RestSearchCtxt *)priv,limits,(RestorationUnitInfo *)B);
          if (iVar23 < iVar42) {
            psVar1 = (short *)((long)B + uVar51 * 2 + 0x20);
            *psVar1 = *psVar1 + sVar26;
            psVar1 = (short *)((long)B + lVar34 * 2 + 0x20);
            *psVar1 = *psVar1 + sVar26;
            B[4] = CONCAT26(B[4]._6_2_ + sVar26 * -2,(uint6)B[4]);
            iVar42 = iVar23;
            break;
          }
          bVar9 = true;
          iVar23 = iVar42;
          bVar53 = true;
        } while (uVar38 == 4);
        if (!bVar9) {
          iVar2 = *(int *)(&DAT_00505168 + uVar51 * 4);
          do {
            iVar18 = (int)*(short *)((long)B + uVar51 * 2 + 0x20) + uVar38;
            if (iVar2 < iVar18) break;
            *(short *)((long)B + uVar51 * 2 + 0x20) = (short)iVar18;
            psVar1 = (short *)((long)B + lVar34 * 2 + 0x20);
            *psVar1 = *psVar1 + sVar26;
            B[4] = CONCAT26(B[4]._6_2_ + sVar26 * -2,(uint6)B[4]);
            iVar23 = try_restoration_unit((RestSearchCtxt *)priv,limits,(RestorationUnitInfo *)B);
            if (iVar42 < iVar23) {
              psVar1 = (short *)((long)B + uVar51 * 2 + 0x20);
              *psVar1 = *psVar1 - sVar26;
              psVar1 = (short *)((long)B + lVar34 * 2 + 0x20);
              *psVar1 = *psVar1 - sVar26;
              B[4] = CONCAT26(B[4]._6_2_ + sVar27,(uint6)B[4]);
              break;
            }
            iVar42 = iVar23;
          } while (uVar38 == 4);
        }
        uVar36 = uVar48;
      } while ((uVar51 < 2) && (uVar51 = uVar51 + 1, !bVar9));
      do {
        iVar2 = *(int *)(&DAT_0050515c + uVar36 * 4);
        lVar34 = 6 - uVar36;
        iVar23 = iVar42;
        bVar53 = false;
        do {
          bVar9 = bVar53;
          iVar18 = (int)*(short *)((long)B + uVar36 * 2 + 0x10) - uVar38;
          iVar42 = iVar23;
          if (iVar18 < iVar2) break;
          *(short *)((long)B + uVar36 * 2 + 0x10) = (short)iVar18;
          psVar1 = (short *)((long)B + lVar34 * 2 + 0x10);
          *psVar1 = *psVar1 - sVar26;
          B[2] = CONCAT26(B[2]._6_2_ + sVar27,(uint6)B[2]);
          iVar42 = try_restoration_unit((RestSearchCtxt *)priv,limits,(RestorationUnitInfo *)B);
          if (iVar23 < iVar42) {
            psVar1 = (short *)((long)B + uVar36 * 2 + 0x10);
            *psVar1 = *psVar1 + sVar26;
            psVar1 = (short *)((long)B + lVar34 * 2 + 0x10);
            *psVar1 = *psVar1 + sVar26;
            B[2] = CONCAT26(B[2]._6_2_ + sVar26 * -2,(uint6)B[2]);
            iVar42 = iVar23;
            break;
          }
          bVar9 = true;
          iVar23 = iVar42;
          bVar53 = true;
        } while (uVar38 == 4);
        if (!bVar9) {
          iVar2 = *(int *)(&DAT_00505168 + uVar36 * 4);
          do {
            iVar18 = (int)*(short *)((long)B + uVar36 * 2 + 0x10) + uVar38;
            if (iVar2 < iVar18) break;
            *(short *)((long)B + uVar36 * 2 + 0x10) = (short)iVar18;
            psVar1 = (short *)((long)B + lVar34 * 2 + 0x10);
            *psVar1 = *psVar1 + sVar26;
            B[2] = CONCAT26(B[2]._6_2_ + sVar26 * -2,(uint6)B[2]);
            iVar23 = try_restoration_unit((RestSearchCtxt *)priv,limits,(RestorationUnitInfo *)B);
            if (iVar42 < iVar23) {
              psVar1 = (short *)((long)B + uVar36 * 2 + 0x10);
              *psVar1 = *psVar1 - sVar26;
              psVar1 = (short *)((long)B + lVar34 * 2 + 0x10);
              *psVar1 = *psVar1 - sVar26;
              B[2] = CONCAT26(B[2]._6_2_ + sVar27,(uint6)B[2]);
              break;
            }
            iVar42 = iVar23;
          } while (uVar38 == 4);
        }
      } while ((uVar36 < 2) && (uVar36 = uVar36 + 1, !bVar9));
      bVar53 = 1 < uVar38;
      uVar38 = uVar38 >> 1;
    } while (bVar53);
  }
  *(int64_t *)((long)priv + 0x68) = iVar42;
  *(int64_t *)wiener_info->hfilter = B[4];
  *(int64_t *)(wiener_info->hfilter + 4) = B[5];
  *(int64_t *)wiener_info->vfilter = B[2];
  *(int64_t *)(wiener_info->vfilter + 4) = B[3];
  iVar2 = *(int *)(lVar4 + 0xb940);
  iVar18 = count_wiener_bits(wiener_win,wiener_info,(WienerInfo *)((long)priv + 0xc0));
  uVar51 = (long)(iVar18 << 9) + (long)iVar2;
  bVar24 = *(char *)(*(long *)(*(long *)((long)priv + 0x10) + 0x6088) + 0x48) * '\x02' - 0x10;
  dVar55 = (double)(*(long *)((long)priv + 0x60) >> (bVar24 & 0x3f)) * 128.0 +
           (double)(int)(uVar30 >> 4) * (double)*(int *)(lVar4 + 0x4218) * 0.001953125;
  dVar5 = (double)(*(long *)((long)priv + 0x68) >> (bVar24 & 0x3f)) * 128.0 +
          (double)(int)(uVar51 >> 4) * (double)*(int *)(lVar4 + 0x4218) * 0.001953125;
  *(uint *)(wiener_info[1].vfilter + 6) = (uint)(dVar5 < dVar55);
  iVar2 = *(int *)(*(long *)((long)priv + 0x38) + 0x30);
  if (iVar2 == 2) {
    bVar53 = dVar55 <= dVar5;
  }
  else {
    if (iVar2 != 1) goto LAB_00203c5c;
    bVar53 = dVar55 * 1.01 < dVar5;
  }
  *(bool *)((long)priv + 0x78) = bVar53;
LAB_00203c5c:
  if (dVar5 < dVar55) {
    uVar30 = uVar51;
  }
  *(long *)((long)priv + 0x88) =
       *(long *)((long)priv + 0x88) + *(long *)((long)priv + (ulong)(dVar5 < dVar55) * 8 + 0x60);
  *(long *)((long)priv + 0xa8) = *(long *)((long)priv + 0xa8) + uVar30;
  if (dVar5 < dVar55) {
    uVar6 = *(undefined8 *)wiener_info->vfilter;
    uVar7 = *(undefined8 *)(wiener_info->vfilter + 4);
    uVar8 = *(undefined8 *)(wiener_info->hfilter + 4);
    *(undefined8 *)((long)priv + 0xd0) = *(undefined8 *)wiener_info->hfilter;
    *(undefined8 *)((long)priv + 0xd8) = uVar8;
    *(undefined8 *)((WienerInfo *)((long)priv + 0xc0))->vfilter = uVar6;
    *(undefined8 *)((long)priv + 200) = uVar7;
  }
  return;
}

Assistant:

static inline void search_wiener(const RestorationTileLimits *limits,
                                 int rest_unit_idx, void *priv, int32_t *tmpbuf,
                                 RestorationLineBuffers *rlbs,
                                 struct aom_internal_error_info *error_info) {
  (void)tmpbuf;
  (void)rlbs;
  (void)error_info;
  RestSearchCtxt *rsc = (RestSearchCtxt *)priv;
  RestUnitSearchInfo *rusi = &rsc->rusi[rest_unit_idx];

  const MACROBLOCK *const x = rsc->x;
  const int64_t bits_none = x->mode_costs.wiener_restore_cost[0];

  // Skip Wiener search for low variance contents
  if (rsc->lpf_sf->prune_wiener_based_on_src_var) {
    const int scale[3] = { 0, 1, 2 };
    // Obtain the normalized Qscale
    const int qs = av1_dc_quant_QTX(rsc->cm->quant_params.base_qindex, 0,
                                    rsc->cm->seq_params->bit_depth) >>
                   3;
    // Derive threshold as sqr(normalized Qscale) * scale / 16,
    const uint64_t thresh =
        (qs * qs * scale[rsc->lpf_sf->prune_wiener_based_on_src_var]) >> 4;
    const int highbd = rsc->cm->seq_params->use_highbitdepth;
    const uint64_t src_var =
        var_restoration_unit(limits, rsc->src, rsc->plane, highbd);
    // Do not perform Wiener search if source variance is lower than threshold
    // or if the reconstruction error is zero
    int prune_wiener = (src_var < thresh) || (rsc->sse[RESTORE_NONE] == 0);
    if (prune_wiener) {
      rsc->total_bits[RESTORE_WIENER] += bits_none;
      rsc->total_sse[RESTORE_WIENER] += rsc->sse[RESTORE_NONE];
      rusi->best_rtype[RESTORE_WIENER - 1] = RESTORE_NONE;
      rsc->sse[RESTORE_WIENER] = INT64_MAX;
      if (rsc->lpf_sf->prune_sgr_based_on_wiener == 2) rsc->skip_sgr_eval = 1;
      return;
    }
  }

  const int wiener_win =
      (rsc->plane == AOM_PLANE_Y) ? WIENER_WIN : WIENER_WIN_CHROMA;

  int reduced_wiener_win = wiener_win;
  if (rsc->lpf_sf->reduce_wiener_window_size) {
    reduced_wiener_win =
        (rsc->plane == AOM_PLANE_Y) ? WIENER_WIN_REDUCED : WIENER_WIN_CHROMA;
  }

  int64_t M[WIENER_WIN2];
  int64_t H[WIENER_WIN2 * WIENER_WIN2];
  int32_t vfilter[WIENER_WIN], hfilter[WIENER_WIN];

#if CONFIG_AV1_HIGHBITDEPTH
  const AV1_COMMON *const cm = rsc->cm;
  if (cm->seq_params->use_highbitdepth) {
    // TODO(any) : Add support for use_downsampled_wiener_stats SF in HBD
    // functions. Optimize intrinsics of HBD design similar to LBD (i.e.,
    // pre-calculate d and s buffers and avoid most of the C operations).
    av1_compute_stats_highbd(reduced_wiener_win, rsc->dgd_buffer,
                             rsc->src_buffer, rsc->dgd_avg, rsc->src_avg,
                             limits->h_start, limits->h_end, limits->v_start,
                             limits->v_end, rsc->dgd_stride, rsc->src_stride, M,
                             H, cm->seq_params->bit_depth);
  } else {
    av1_compute_stats(reduced_wiener_win, rsc->dgd_buffer, rsc->src_buffer,
                      rsc->dgd_avg, rsc->src_avg, limits->h_start,
                      limits->h_end, limits->v_start, limits->v_end,
                      rsc->dgd_stride, rsc->src_stride, M, H,
                      rsc->lpf_sf->use_downsampled_wiener_stats);
  }
#else
  av1_compute_stats(reduced_wiener_win, rsc->dgd_buffer, rsc->src_buffer,
                    rsc->dgd_avg, rsc->src_avg, limits->h_start, limits->h_end,
                    limits->v_start, limits->v_end, rsc->dgd_stride,
                    rsc->src_stride, M, H,
                    rsc->lpf_sf->use_downsampled_wiener_stats);
#endif

  wiener_decompose_sep_sym(reduced_wiener_win, M, H, vfilter, hfilter);

  RestorationUnitInfo rui;
  memset(&rui, 0, sizeof(rui));
  rui.restoration_type = RESTORE_WIENER;
  finalize_sym_filter(reduced_wiener_win, vfilter, rui.wiener_info.vfilter);
  finalize_sym_filter(reduced_wiener_win, hfilter, rui.wiener_info.hfilter);

  // Filter score computes the value of the function x'*A*x - x'*b for the
  // learned filter and compares it against identity filer. If there is no
  // reduction in the function, the filter is reverted back to identity
  if (compute_score(reduced_wiener_win, M, H, rui.wiener_info.vfilter,
                    rui.wiener_info.hfilter) > 0) {
    rsc->total_bits[RESTORE_WIENER] += bits_none;
    rsc->total_sse[RESTORE_WIENER] += rsc->sse[RESTORE_NONE];
    rusi->best_rtype[RESTORE_WIENER - 1] = RESTORE_NONE;
    rsc->sse[RESTORE_WIENER] = INT64_MAX;
    if (rsc->lpf_sf->prune_sgr_based_on_wiener == 2) rsc->skip_sgr_eval = 1;
    return;
  }

  rsc->sse[RESTORE_WIENER] =
      finer_search_wiener(rsc, limits, &rui, reduced_wiener_win);
  rusi->wiener = rui.wiener_info;

  if (reduced_wiener_win != WIENER_WIN) {
    assert(rui.wiener_info.vfilter[0] == 0 &&
           rui.wiener_info.vfilter[WIENER_WIN - 1] == 0);
    assert(rui.wiener_info.hfilter[0] == 0 &&
           rui.wiener_info.hfilter[WIENER_WIN - 1] == 0);
  }

  const int64_t bits_wiener =
      x->mode_costs.wiener_restore_cost[1] +
      (count_wiener_bits(wiener_win, &rusi->wiener, &rsc->ref_wiener)
       << AV1_PROB_COST_SHIFT);

  double cost_none = RDCOST_DBL_WITH_NATIVE_BD_DIST(
      x->rdmult, bits_none >> 4, rsc->sse[RESTORE_NONE],
      rsc->cm->seq_params->bit_depth);
  double cost_wiener = RDCOST_DBL_WITH_NATIVE_BD_DIST(
      x->rdmult, bits_wiener >> 4, rsc->sse[RESTORE_WIENER],
      rsc->cm->seq_params->bit_depth);

  RestorationType rtype =
      (cost_wiener < cost_none) ? RESTORE_WIENER : RESTORE_NONE;
  rusi->best_rtype[RESTORE_WIENER - 1] = rtype;

  // Set 'skip_sgr_eval' based on rdcost ratio of RESTORE_WIENER and
  // RESTORE_NONE or based on best_rtype
  if (rsc->lpf_sf->prune_sgr_based_on_wiener == 1) {
    rsc->skip_sgr_eval = cost_wiener > (1.01 * cost_none);
  } else if (rsc->lpf_sf->prune_sgr_based_on_wiener == 2) {
    rsc->skip_sgr_eval = rusi->best_rtype[RESTORE_WIENER - 1] == RESTORE_NONE;
  }

#if DEBUG_LR_COSTING
  // Store ref params for later checking
  lr_ref_params[RESTORE_WIENER][rsc->plane][rest_unit_idx].wiener_info =
      rsc->ref_wiener;
#endif  // DEBUG_LR_COSTING

  rsc->total_sse[RESTORE_WIENER] += rsc->sse[rtype];
  rsc->total_bits[RESTORE_WIENER] +=
      (cost_wiener < cost_none) ? bits_wiener : bits_none;
  if (cost_wiener < cost_none) rsc->ref_wiener = rusi->wiener;
}